

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * cmSystemTools::RelativeIfUnder(string *__return_storage_ptr__,string *top,string *in)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  long *local_40 [2];
  long local_30 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __n = in->_M_string_length;
  if (__n == top->_M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((in->_M_dataplus)._M_p,(top->_M_dataplus)._M_p,__n);
      if (iVar2 != 0) goto LAB_002d38d3;
    }
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x816a11);
  }
  else {
LAB_002d38d3:
    bVar1 = cmsys::SystemTools::IsSubDirectory(in,top);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)in);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::RelativeIfUnder(std::string const& top,
                                           std::string const& in)
{
  std::string out;
  if (in == top) {
    out = ".";
  } else if (cmSystemTools::IsSubDirectory(in, top)) {
    out = in.substr(top.size() + 1);
  } else {
    out = in;
  }
  return out;
}